

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_sched_perf.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  bool bVar2;
  ostream *poVar3;
  TaskPool *this;
  Task *task_ptr;
  void *pvVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  char local_3c [3];
  char local_39;
  double local_38;
  
  process_arguments(argc,argv);
  depspawn::set_threads(Nthreads);
  if (-1 < Queue_limit) {
    depspawn::set_task_queue_limit(Queue_limit);
  }
  std::vector<double,_std::allocator<double>_>::resize(&TSeq,(long)NReps);
  std::vector<double,_std::allocator<double>_>::resize(&TPar,(long)NReps);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,Nthreads);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," threads max_tile_size=",0x17);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," NReps=",7);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,NReps);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ClearCache=",0xc);
  local_3c[2] = 0x4e;
  if (ClearCaches != false) {
    local_3c[2] = 0x59;
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_3c + 2,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," QueueLimit=",0xc);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,Queue_limit);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," EnqueueTasks=",0xe);
  local_39 = 'N';
  if (depspawn::internal::EnqueueTasks != '\0') {
    local_39 = 'Y';
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_39,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," Baseline=",10);
  pcVar5 = "Sequential";
  if (ParallelBaseline != 0) {
    pcVar5 = "Parallel";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,pcVar5,(ulong)(ParallelBaseline ^ 1) * 2 + 8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"non-",4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"TBB parallel baseline version\n",0x1e);
  if (OnlyParallelRun == false) {
    this = depspawn::get_task_pool();
    if (this->finish_ == true) {
      LOCK();
      (this->busy_threads_).super___atomic_base<int>._M_i = (this->thread_pool_).nthreads_in_use_;
      UNLOCK();
      this->finish_ = false;
      depspawn::internal::ThreadPool::launch_theads(&this->thread_pool_);
    }
    lVar6 = 0;
    do {
      task_ptr = LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::intl_malloc
                           (&this->task_pool_);
      *(undefined8 *)&(task_ptr->func_).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(task_ptr->func_).super__Function_base._M_functor + 8) = 0;
      (task_ptr->func_).super__Function_base._M_manager = (_Manager_type)0x0;
      (task_ptr->func_)._M_invoker = (_Invoker_type)0x0;
      pvVar4 = operator_new(0x10);
      *(long *)((long)pvVar4 + 8) = lVar6;
      *(void **)&(task_ptr->func_).super__Function_base._M_functor = pvVar4;
      (task_ptr->func_)._M_invoker =
           std::
           _Function_handler<void_(),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fraguela[P]depspawn/tests/bench_sched_perf.cpp:286:23)_(unsigned_long)>_>
           ::_M_invoke;
      (task_ptr->func_).super__Function_base._M_manager =
           std::
           _Function_handler<void_(),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fraguela[P]depspawn/tests/bench_sched_perf.cpp:286:23)_(unsigned_long)>_>
           ::_M_manager;
      task_ptr->ctx_ = (Workitem *)0x0;
      task_ptr->next = (Task *)this;
      depspawn::internal::TaskPool::enqueue(this,task_ptr);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x4000);
    do {
      do {
        bVar2 = depspawn::internal::TaskPool::try_run(this);
      } while (bVar2);
    } while ((this->busy_threads_).super___atomic_base<int>._M_i != 0);
    this->finish_ = true;
    do {
      do {
      } while ((this->thread_pool_).ready_ != false);
    } while ((this->thread_pool_).count_ != 0);
    bench_parallel_time(MaxNTasks,1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"size %",6);
  if (0x7f < MaxNTasks) {
    uVar7 = 0x80;
    do {
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 5;
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    ",4);
      uVar7 = uVar7 * 2;
    } while (uVar7 <= MaxNTasks);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"tasks\n",6);
  if (9 < MaxTileSize) {
    sVar8 = 10;
    do {
      if (Verbosity != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Tests for TSZ=",0xe);
      }
      lVar6 = std::cout;
      *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xffffff4f
           | 0x80;
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar6 + -0x18)) = 3;
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      local_3c[0] = ' ';
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_3c,1);
      *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffff4f | 0x20;
      if (Verbosity != 0) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
        std::ostream::put('@');
        std::ostream::flush();
      }
      cur_tile_sz = sVar8;
      if (0x7f < MaxNTasks) {
        uVar7 = 0x80;
        do {
          dVar1 = bench_sched_perf(uVar7);
          uVar9 = SUB84(dVar1,0);
          uVar10 = (undefined4)((ulong)dVar1 >> 0x20);
          if (Verbosity != 0) {
            local_38 = dVar1;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TSZ=",4);
            poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," NTASKS=",8);
            poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," r=",3);
            uVar9 = SUB84(local_38,0);
            uVar10 = (undefined4)((ulong)local_38 >> 0x20);
          }
          *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18))
               = 8;
          poVar3 = std::ostream::_M_insert<double>((double)CONCAT44(uVar10,uVar9));
          local_3c[1] = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_3c + 1,1);
          if (Verbosity != 0) {
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
            std::ostream::put('@');
            std::ostream::flush();
          }
          uVar7 = uVar7 * 2;
        } while (uVar7 <= MaxNTasks);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
      std::ostream::put('@');
      std::ostream::flush();
      sVar8 = sVar8 + 5;
    } while (sVar8 <= MaxTileSize);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
  process_arguments(argc, argv);
  
  //test_TP("before set_threads");
  set_threads(Nthreads);
  //test_TP("after set_threads");
  
  if (Queue_limit >= 0) {
    set_task_queue_limit(Queue_limit);
  }
  
  TSeq.resize(NReps);
  TPar.resize(NReps);

  std::cout << Nthreads << " threads max_tile_size=" << MaxTileSize << " NReps=" << NReps << " ClearCache=" << (ClearCaches ? 'Y' : 'N') << " QueueLimit=" << Queue_limit << " EnqueueTasks=" << (depspawn::internal::EnqueueTasks ? 'Y' : 'N') << " Baseline=" << (ParallelBaseline ? "Parallel" : "Sequential") << std::endl;

  std::cout <<
#ifndef USE_TBB
  "non-" <<
#endif
  "TBB parallel baseline version\n";

  if(!OnlyParallelRun) {
    const auto task = [] (size_t i) { Destination[i].clear(); };

#ifdef USE_TBB
    // This is to try to build the threads before the first test; just in case
    tbb::parallel_for(size_t(0), MAX_NTASKS, task);
#else
    get_task_pool().parallel_for((size_t)0, MAX_NTASKS, (size_t)1, task, false);
//    TP->launch_threads();
//    for (size_t i = 0; i < MAX_NTASKS; i++) {
//      TP->enqueue(task, i);
//    }
//    TP->wait(false);
#endif

    //1-time runtime preheat (for memory pools)
    bench_parallel_time(MaxNTasks, 1);
  }
  
  std::cout << "size %";
  for (size_t ntasks = (1 << 7); ntasks <= MaxNTasks; ntasks *= 2) {
    std::cout << std::setw(5) << ntasks << "    ";
  }
  std::cout << "tasks\n";
  
  for (size_t tile_sz=10; tile_sz <= MaxTileSize; tile_sz += 5) {
    if (Verbosity) {
      std::cout << "Tests for TSZ=";
    }
    std::cout << std::right << std::setw(3) << tile_sz << ' ' << std::left;
    if (Verbosity) {
      std::cout << std::endl;
    }
    cur_tile_sz = tile_sz;
    for (size_t ntasks = (1 << 7); ntasks <= MaxNTasks; ntasks *= 2) {
      const double normalized_par_to_seq_ratio = bench_sched_perf(ntasks);
      if (Verbosity) {
        std::cout << "TSZ=" << tile_sz << " NTASKS=" << ntasks << " r=";
      }
      std::cout << std::setw(8) << normalized_par_to_seq_ratio << ' ';
      if (Verbosity) {
        std::cout << std::endl;
      }
    }
    //std::cout << '%' << tile_sz;
    std::cout << std::endl;
  }
  
  //test_TP("before exiting");
  
  return 0;
}